

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O0

uint crnlib::math::bitmask_ofs(uint mask)

{
  uint ofs;
  uint mask_local;
  undefined4 local_4;
  
  if (mask == 0) {
    local_4 = 0;
  }
  else {
    ofs = 0;
    for (mask_local = mask; (mask_local & 1) == 0; mask_local = mask_local >> 1) {
      ofs = ofs + 1;
    }
    local_4 = ofs;
  }
  return local_4;
}

Assistant:

inline uint bitmask_ofs(uint mask) {
  if (!mask)
    return 0;
  uint ofs = 0;
  while ((mask & 1U) == 0) {
    mask >>= 1U;
    ofs++;
  }
  return ofs;
}